

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.hpp
# Opt level: O3

State * __thiscall
Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
predict<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
          (UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *this,
          SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase> *s,
          Control<float> *u)

{
  bool bVar1;
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *local_48;
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *local_40;
  Vector<float,_3> local_34;
  
  bVar1 = UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::computeSigmaPoints
                    ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this);
  if (bVar1) {
    UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>>::
    computeSigmaPointTransition<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
              ((UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>> *)this,s,u);
    local_40 = this + 0xc;
    local_48 = this + 0x44;
    Vector<float,3>::
    Vector<Eigen::Product<Eigen::Matrix<float,3,7,0,3,7>,Eigen::Matrix<float,7,1,0,7,1>,0>>
              (&local_34,
               (MatrixBase<Eigen::Product<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_Eigen::Matrix<float,_7,_1,_0,_7,_1>,_0>_>
                *)&local_48);
    *(float *)(this + 8) =
         local_34.super_Matrix<float,_3,_1>.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    *(undefined8 *)this =
         local_34.super_Matrix<float,_3,_1>.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._0_8_;
    UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
    computeCovarianceFromSigmaPoints<KalmanExamples::Robot1::State<float>_>
              ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
               (State<float> *)this,
               (SigmaPoints<KalmanExamples::Robot1::State<float>_> *)(this + 0x44),
               &(s->super_StandardBase<KalmanExamples::Robot1::State<float>_>).P,
               (Covariance<KalmanExamples::Robot1::State<float>_> *)(this + 0xac));
    return (State *)this;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/include/kalman/UnscentedKalmanFilter.hpp"
                ,0x87,
                "const State &Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::predict(const SystemModelType<Control, CovarianceBase> &, const Control &) [StateType = KalmanExamples::Robot1::State<float>, Control = KalmanExamples::Robot1::Control<float>, CovarianceBase = Kalman::StandardBase]"
               );
}

Assistant:

const State& predict( const SystemModelType<Control, CovarianceBase>& s, const Control& u )
        {
            // Compute sigma points
            if(!computeSigmaPoints())
            {
                // TODO: handle numerical error
                assert(false);
            }
            
            // Compute predicted state
            x = this->template computeStatePrediction<Control, CovarianceBase>(s, u);
            
            // Compute predicted covariance
            computeCovarianceFromSigmaPoints(x, sigmaStatePoints, s.getCovariance(), P);
            
            // Return predicted state
            return this->getState();
        }